

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS ref_smooth_tet_nso_step(REF_GRID ref_grid,REF_INT node,REF_BOOL *complete)

{
  double dVar1;
  double dVar2;
  double dVar3;
  REF_NODE ref_node_00;
  REF_CELL ref_cell_00;
  REF_INTERP pRVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double local_520;
  double local_518;
  double local_508;
  REF_INT local_500;
  REF_INT local_4fc;
  int local_4f8;
  REF_STATUS ref_private_macro_code_rxs_2;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rxs;
  REF_BOOL skip;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_DBL P [16];
  REF_DBL NtinvNNtN [16];
  REF_DBL NtinvNNt [16];
  REF_DBL invNNt [16];
  REF_DBL NNt [16];
  REF_DBL N [16];
  REF_INT k;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INTERP ref_interp;
  uint local_1b0;
  REF_INT interp_guess;
  REF_STATUS interp_status;
  REF_BOOL verbose;
  REF_DBL last_qual;
  REF_DBL last_alpha;
  REF_INT nactive;
  REF_DBL active_tol;
  REF_DBL xyz [3];
  REF_DBL requirement;
  int local_160;
  REF_INT max_reductions;
  REF_INT reductions;
  REF_INT mate;
  REF_DBL min_alpha;
  REF_DBL alpha;
  REF_DBL m0;
  REF_DBL m1;
  REF_DBL dir [3];
  int local_114;
  int local_110;
  REF_INT ixyz;
  REF_INT j;
  REF_INT i;
  REF_DBL min_qual;
  REF_INT degree;
  REF_INT worst;
  REF_DBL *grads;
  REF_DBL *quals;
  REF_INT *active;
  REF_INT *cells;
  REF_DBL d_quality [3];
  REF_DBL quality;
  REF_INT nodes [27];
  REF_INT local_40;
  int local_3c;
  REF_INT cell;
  REF_INT item;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_BOOL *complete_local;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  ref_cell_00 = ref_grid->cell[8];
  d_quality[2] = 0.0;
  pRVar4 = ref_grid->interp;
  *complete = 0;
  dVar1 = ref_node_00->real[node * 0xf];
  dVar2 = ref_node_00->real[node * 0xf + 1];
  dVar3 = ref_node_00->real[node * 0xf + 2];
  ref_interp._4_4_ = -1;
  if ((pRVar4 != (REF_INTERP)0x0) && (pRVar4->continuously != 0)) {
    ref_interp._4_4_ = pRVar4->cell[node];
  }
  local_1b0 = 0;
  ref_grid_local._4_4_ = ref_adj_degree(ref_cell_00->ref_adj,node,(REF_INT *)&min_qual);
  if (ref_grid_local._4_4_ == 0) {
    if (min_qual._0_4_ < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x804,"ref_smooth_tet_nso_step","malloc cells of REF_INT negative");
      ref_grid_local._4_4_ = 1;
    }
    else {
      active = (REF_INT *)malloc((long)min_qual._0_4_ << 2);
      if (active == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x804,"ref_smooth_tet_nso_step","malloc cells of REF_INT NULL");
        ref_grid_local._4_4_ = 2;
      }
      else if (min_qual._0_4_ < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x805,"ref_smooth_tet_nso_step","malloc active of REF_INT negative");
        ref_grid_local._4_4_ = 1;
      }
      else {
        quals = (REF_DBL *)malloc((long)min_qual._0_4_ << 2);
        if (quals == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x805,"ref_smooth_tet_nso_step","malloc active of REF_INT NULL");
          ref_grid_local._4_4_ = 2;
        }
        else if (min_qual._0_4_ < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x806,"ref_smooth_tet_nso_step","malloc quals of REF_DBL negative");
          ref_grid_local._4_4_ = 1;
        }
        else {
          grads = (REF_DBL *)malloc((long)min_qual._0_4_ << 3);
          if (grads == (REF_DBL *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x806,"ref_smooth_tet_nso_step","malloc quals of REF_DBL NULL");
            ref_grid_local._4_4_ = 2;
          }
          else if (min_qual._0_4_ * 3 < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x807,"ref_smooth_tet_nso_step","malloc grads of REF_DBL negative");
            ref_grid_local._4_4_ = 1;
          }
          else {
            _degree = (double *)malloc((long)(min_qual._0_4_ * 3) << 3);
            if (_degree == (double *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x807,"ref_smooth_tet_nso_step","malloc grads of REF_DBL NULL");
              ref_grid_local._4_4_ = 2;
            }
            else {
              _j = 1.0;
              min_qual._4_4_ = -1;
              min_qual._0_4_ = 0;
              if ((node < 0) || (ref_cell_00->ref_adj->nnode <= node)) {
                local_4f8 = -1;
              }
              else {
                local_4f8 = ref_cell_00->ref_adj->first[node];
              }
              local_3c = local_4f8;
              if (local_4f8 == -1) {
                local_4fc = -1;
              }
              else {
                local_4fc = ref_cell_00->ref_adj->item[local_4f8].ref;
              }
              local_40 = local_4fc;
              while (local_3c != -1) {
                uVar6 = ref_cell_nodes(ref_cell_00,local_40,(REF_INT *)&quality);
                if (uVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x80d,"ref_smooth_tet_nso_step",(ulong)uVar6,"nodes");
                  return uVar6;
                }
                uVar6 = ref_cell_orient_node0(4,node,(REF_INT *)&quality);
                if (uVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x80e,"ref_smooth_tet_nso_step",(ulong)uVar6,"orient");
                  return uVar6;
                }
                uVar6 = ref_node_tet_dquality_dnode0
                                  (ref_node_00,(REF_INT *)&quality,d_quality + 2,(REF_DBL *)&cells);
                if (uVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x810,"ref_smooth_tet_nso_step",(ulong)uVar6,"qual");
                  return uVar6;
                }
                if ((d_quality[2] < _j) || (min_qual._4_4_ == -1)) {
                  min_qual._4_4_ = min_qual._0_4_;
                  _j = d_quality[2];
                }
                active[min_qual._0_4_] = local_40;
                grads[min_qual._0_4_] = d_quality[2];
                _degree[min_qual._0_4_ * 3] = (double)cells;
                _degree[min_qual._0_4_ * 3 + 1] = d_quality[0];
                _degree[min_qual._0_4_ * 3 + 2] = d_quality[1];
                min_qual._0_4_ = min_qual._0_4_ + 1;
                local_3c = ref_cell_00->ref_adj->item[local_3c].next;
                if (local_3c == -1) {
                  local_500 = -1;
                }
                else {
                  local_500 = ref_cell_00->ref_adj->item[local_3c].ref;
                }
                local_40 = local_500;
              }
              *(int *)quals = min_qual._4_4_;
              last_alpha._4_4_ = 1;
              for (ixyz = 0; ixyz < min_qual._0_4_; ixyz = ixyz + 1) {
                if ((ixyz != min_qual._4_4_) && (grads[ixyz] - grads[*(int *)quals] < 1e-12)) {
                  *(REF_INT *)((long)quals + (long)last_alpha._4_4_ * 4) = ixyz;
                  last_alpha._4_4_ = last_alpha._4_4_ + 1;
                }
              }
              if (last_alpha._4_4_ < 4) {
                if (last_alpha._4_4_ == 1) {
                  m1 = _degree[min_qual._4_4_ * 3];
                  dir[0] = _degree[min_qual._4_4_ * 3 + 1];
                  dir[1] = _degree[min_qual._4_4_ * 3 + 2];
                }
                else {
                  for (ixyz = 0; ixyz < last_alpha._4_4_; ixyz = ixyz + 1) {
                    NNt[(long)ixyz + 0xf] = 1.0;
                    for (local_114 = 0; local_114 < 3; local_114 = local_114 + 1) {
                      NNt[(long)(ixyz + last_alpha._4_4_ * (local_114 + 1)) + 0xf] =
                           -_degree[local_114 + *(int *)((long)quals + (long)ixyz * 4) * 3];
                    }
                  }
                  for (ixyz = 0; ixyz < last_alpha._4_4_; ixyz = ixyz + 1) {
                    for (local_110 = 0; local_110 < last_alpha._4_4_; local_110 = local_110 + 1) {
                      invNNt[(long)(ixyz + local_110 * last_alpha._4_4_) + 0xf] = 0.0;
                    }
                  }
                  for (ixyz = 0; ixyz < last_alpha._4_4_; ixyz = ixyz + 1) {
                    for (local_110 = 0; local_110 < last_alpha._4_4_; local_110 = local_110 + 1) {
                      for (N[0xf]._4_4_ = 0; N[0xf]._4_4_ < 4; N[0xf]._4_4_ = N[0xf]._4_4_ + 1) {
                        lVar7 = (long)(ixyz + local_110 * last_alpha._4_4_);
                        invNNt[lVar7 + 0xf] =
                             NNt[(long)(ixyz + last_alpha._4_4_ * N[0xf]._4_4_) + 0xf] *
                             NNt[(long)(local_110 + last_alpha._4_4_ * N[0xf]._4_4_) + 0xf] +
                             invNNt[lVar7 + 0xf];
                      }
                    }
                  }
                  uVar6 = ref_matrix_inv_gen(last_alpha._4_4_,invNNt + 0xf,NtinvNNt + 0xf);
                  if (uVar6 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                           ,0x848,"ref_smooth_tet_nso_step",(ulong)uVar6,"inv");
                    return uVar6;
                  }
                  for (ixyz = 0; ixyz < 4; ixyz = ixyz + 1) {
                    for (local_110 = 0; local_110 < last_alpha._4_4_; local_110 = local_110 + 1) {
                      NtinvNNtN[(long)(ixyz + local_110 * 4) + 0xf] = 0.0;
                    }
                  }
                  for (ixyz = 0; ixyz < 4; ixyz = ixyz + 1) {
                    for (local_110 = 0; local_110 < last_alpha._4_4_; local_110 = local_110 + 1) {
                      for (N[0xf]._4_4_ = 0; N[0xf]._4_4_ < last_alpha._4_4_;
                          N[0xf]._4_4_ = N[0xf]._4_4_ + 1) {
                        lVar7 = (long)(ixyz + local_110 * 4);
                        NtinvNNtN[lVar7 + 0xf] =
                             NNt[(long)(N[0xf]._4_4_ + ixyz * last_alpha._4_4_) + 0xf] *
                             NtinvNNt[(long)(N[0xf]._4_4_ + local_110 * last_alpha._4_4_) + 0xf] +
                             NtinvNNtN[lVar7 + 0xf];
                      }
                    }
                  }
                  for (ixyz = 0; ixyz < 4; ixyz = ixyz + 1) {
                    for (local_110 = 0; local_110 < 4; local_110 = local_110 + 1) {
                      P[(long)(ixyz + local_110 * 4) + 0xf] = 0.0;
                    }
                  }
                  for (ixyz = 0; ixyz < 4; ixyz = ixyz + 1) {
                    for (local_110 = 0; local_110 < 4; local_110 = local_110 + 1) {
                      for (N[0xf]._4_4_ = 0; N[0xf]._4_4_ < last_alpha._4_4_;
                          N[0xf]._4_4_ = N[0xf]._4_4_ + 1) {
                        lVar7 = (long)(ixyz + local_110 * 4);
                        P[lVar7 + 0xf] =
                             NtinvNNtN[(long)(ixyz + N[0xf]._4_4_ * 4) + 0xf] *
                             NNt[(long)(N[0xf]._4_4_ + local_110 * last_alpha._4_4_) + 0xf] +
                             P[lVar7 + 0xf];
                      }
                    }
                  }
                  for (ixyz = 0; ixyz < 4; ixyz = ixyz + 1) {
                    for (local_110 = 0; local_110 < 4; local_110 = local_110 + 1) {
                      *(double *)(&ref_private_macro_code_rss_5 + (long)(ixyz + local_110 * 4) * 2)
                           = -P[(long)(ixyz + local_110 * 4) + 0xf];
                    }
                  }
                  for (ixyz = 0; ixyz < 4; ixyz = ixyz + 1) {
                    *(double *)(&ref_private_macro_code_rss_5 + (long)(ixyz * 5) * 2) =
                         *(double *)(&ref_private_macro_code_rss_5 + (long)(ixyz * 5) * 2) + 1.0;
                  }
                  for (local_114 = 0; local_114 < 3; local_114 = local_114 + 1) {
                    dir[(long)local_114 + -1] =
                         *(REF_DBL *)(&ref_private_macro_code_rss_5 + (long)(local_114 + 1) * 2);
                  }
                }
                uVar6 = ref_math_normalize(&m1);
                if (uVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x861,"ref_smooth_tet_nso_step",(ulong)uVar6,"norm");
                  return uVar6;
                }
                dVar8 = dir[1] * _degree[(long)(min_qual._4_4_ * 3) + 2] +
                        m1 * _degree[min_qual._4_4_ * 3] +
                        dir[0] * _degree[(long)(min_qual._4_4_ * 3) + 1];
                if (0.0 < dVar8) {
                  max_reductions = -1;
                  _reductions = 10000000000.0;
                  for (ixyz = 0; ixyz < min_qual._0_4_; ixyz = ixyz + 1) {
                    bVar5 = false;
                    for (local_110 = 0; local_110 < last_alpha._4_4_; local_110 = local_110 + 1) {
                      if (ixyz == *(int *)((long)quals + (long)local_110 * 4)) {
                        bVar5 = true;
                      }
                    }
                    if (!bVar5) {
                      dVar9 = dir[1] * _degree[(long)(ixyz * 3) + 2] +
                              m1 * _degree[ixyz * 3] + dir[0] * _degree[(long)(ixyz * 3) + 1];
                      if ((dVar9 - dVar8) * 1e+20 <= 0.0) {
                        local_508 = -((dVar9 - dVar8) * 1e+20);
                      }
                      else {
                        local_508 = (dVar9 - dVar8) * 1e+20;
                      }
                      if (grads[min_qual._4_4_] - grads[ixyz] <= 0.0) {
                        local_518 = -(grads[min_qual._4_4_] - grads[ixyz]);
                      }
                      else {
                        local_518 = grads[min_qual._4_4_] - grads[ixyz];
                      }
                      if (((local_518 < local_508) &&
                          (dVar9 = (grads[min_qual._4_4_] - grads[ixyz]) / (dVar9 - dVar8),
                          0.0 < dVar9)) && (dVar9 < _reductions)) {
                        max_reductions = ixyz;
                        _reductions = dVar9;
                      }
                    }
                  }
                  if (max_reductions == -1) {
                    _reductions = (1.0 - *grads) /
                                  (dir[1] * _degree[2] + m1 * *_degree + dir[0] * _degree[1]);
                    for (ixyz = 1; ixyz < min_qual._0_4_; ixyz = ixyz + 1) {
                      if ((1.0 - grads[ixyz]) /
                          (dir[1] * _degree[(long)(ixyz * 3) + 2] +
                          m1 * _degree[ixyz * 3] + dir[0] * _degree[(long)(ixyz * 3) + 1]) <=
                          _reductions) {
                        local_520 = (1.0 - grads[ixyz]) /
                                    (dir[1] * _degree[(long)(ixyz * 3) + 2] +
                                    m1 * _degree[ixyz * 3] + dir[0] * _degree[(long)(ixyz * 3) + 1])
                        ;
                      }
                      else {
                        local_520 = _reductions;
                      }
                      _reductions = local_520;
                    }
                  }
                  min_alpha = _reductions;
                  last_qual = 0.0;
                  _interp_status = 0.0;
                  for (local_160 = 0; local_160 < 8; local_160 = local_160 + 1) {
                    ref_node_00->real[node * 0xf] = min_alpha * m1 + dVar1;
                    ref_node_00->real[node * 0xf + 1] = min_alpha * dir[0] + dVar2;
                    ref_node_00->real[node * 0xf + 2] = min_alpha * dir[1] + dVar3;
                    local_1b0 = ref_metric_interpolate_node(ref_grid,node);
                    if ((local_1b0 != 0) && (local_1b0 != 5)) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                             ,0x89a,"ref_smooth_tet_nso_step",(ulong)local_1b0,
                             "ref_metric_interpolate_node failed");
                      return local_1b0;
                    }
                    uVar6 = ref_smooth_tet_quality_around(ref_grid,node,d_quality + 2);
                    if (uVar6 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                             ,0x89c,"ref_smooth_tet_nso_step",(ulong)uVar6,"rep");
                      return uVar6;
                    }
                    if (((local_1b0 == 0) && (0 < local_160)) &&
                       ((d_quality[2] < _interp_status && (_j < d_quality[2])))) {
                      d_quality[2] = _interp_status;
                      ref_node_00->real[node * 0xf] = last_qual * m1 + dVar1;
                      ref_node_00->real[node * 0xf + 1] = last_qual * dir[0] + dVar2;
                      ref_node_00->real[node * 0xf + 2] = last_qual * dir[1] + dVar3;
                      uVar6 = ref_metric_interpolate_node(ref_grid,node);
                      if ((uVar6 != 0) && (uVar6 != 5)) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                               ,0x8ab,"ref_smooth_tet_nso_step",(ulong)uVar6,"interp");
                        return uVar6;
                      }
                      break;
                    }
                    if ((min_alpha * 0.9 * dVar8 + grads[min_qual._4_4_] < d_quality[2]) ||
                       (min_alpha < 1e-12)) break;
                    last_qual = min_alpha;
                    _interp_status = d_quality[2];
                    min_alpha = min_alpha * 0.5;
                  }
                  if (7 < local_160) {
                    ref_node_00->real[node * 0xf] = dVar1;
                    ref_node_00->real[node * 0xf + 1] = dVar2;
                    ref_node_00->real[node * 0xf + 2] = dVar3;
                    if ((local_1b0 != 0) && (ref_interp._4_4_ != -1)) {
                      pRVar4->cell[node] = ref_interp._4_4_;
                    }
                    uVar6 = ref_metric_interpolate_node(ref_grid,node);
                    if ((uVar6 != 0) && (uVar6 != 5)) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                             ,0x8bb,"ref_smooth_tet_nso_step",(ulong)uVar6,"interp");
                      return uVar6;
                    }
                    *complete = 1;
                  }
                  if ((last_alpha._4_4_ == 3) && (d_quality[2] - _j < 1e-05)) {
                    *complete = 1;
                  }
                }
                else {
                  printf("%s: %d: %s: m0 not positive %e",dVar8,
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x868,"ref_smooth_tet_nso_step");
                  *complete = 1;
                }
              }
              else {
                *complete = 1;
              }
              if (_degree != (double *)0x0) {
                free(_degree);
              }
              if (grads != (REF_DBL *)0x0) {
                free(grads);
              }
              if (quals != (REF_DBL *)0x0) {
                free(quals);
              }
              if (active != (REF_INT *)0x0) {
                free(active);
              }
              ref_grid_local._4_4_ = 0;
            }
          }
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x802,
           "ref_smooth_tet_nso_step",(ulong)ref_grid_local._4_4_,"deg");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_tet_nso_step(REF_GRID ref_grid,
                                                  REF_INT node,
                                                  REF_BOOL *complete) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL quality = 0.0, d_quality[3];
  REF_INT *cells, *active;
  REF_DBL *quals, *grads;
  REF_INT worst, degree;
  REF_DBL min_qual;
  REF_INT i, j, ixyz;
  REF_DBL dir[3];
  REF_DBL m1, m0, alpha, min_alpha;
  REF_INT mate, reductions, max_reductions;
  REF_DBL requirement;
  REF_DBL xyz[3];
  REF_DBL active_tol = 1.0e-12;
  REF_INT nactive;
  REF_DBL last_alpha, last_qual;
  REF_BOOL verbose = REF_FALSE;
  REF_STATUS interp_status;
  REF_INT interp_guess;
  REF_INTERP ref_interp = ref_grid_interp(ref_grid);

  *complete = REF_FALSE;

  xyz[0] = ref_node_xyz(ref_node, 0, node);
  xyz[1] = ref_node_xyz(ref_node, 1, node);
  xyz[2] = ref_node_xyz(ref_node, 2, node);
  interp_guess = REF_EMPTY;
  if (NULL != ref_interp) {
    if (ref_interp_continuously(ref_interp)) {
      interp_guess = ref_interp_cell(ref_interp, node);
    }
  }
  interp_status = REF_SUCCESS;

  RSS(ref_adj_degree(ref_cell_adj(ref_cell), node, &degree), "deg");

  ref_malloc(cells, degree, REF_INT);
  ref_malloc(active, degree, REF_INT);
  ref_malloc(quals, degree, REF_DBL);
  ref_malloc(grads, 3 * degree, REF_DBL);

  min_qual = 1.0;
  worst = REF_EMPTY;
  degree = 0;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    RSS(ref_cell_orient_node0(4, node, nodes), "orient");
    RSS(ref_node_tet_dquality_dnode0(ref_node, nodes, &quality, d_quality),
        "qual");
    if (quality < min_qual || REF_EMPTY == worst) {
      worst = degree;
      min_qual = quality;
    }
    cells[degree] = cell;
    quals[degree] = quality;
    grads[0 + 3 * degree] = d_quality[0];
    grads[1 + 3 * degree] = d_quality[1];
    grads[2 + 3 * degree] = d_quality[2];
    degree++;
  }
  active[0] = worst;
  nactive = 1;
  for (i = 0; i < degree; i++) {
    if (i == worst) continue;
    if ((quals[i] - quals[active[0]]) < active_tol) {
      active[nactive] = i;
      nactive++;
    }
  }
  if (verbose)
    for (i = 0; i < nactive; i++)
      printf("%2d: %10.5f %10.5f %10.5f\n", active[i], grads[0 + 3 * active[i]],
             grads[1 + 3 * active[i]], grads[2 + 3 * active[i]]);

  if (4 <= nactive) {
    *complete = REF_TRUE;
    goto success_clean_and_return;
  }

  if (1 == nactive) {
    dir[0] = grads[0 + 3 * worst];
    dir[1] = grads[1 + 3 * worst];
    dir[2] = grads[2 + 3 * worst];
  } else { /* Charalambous and Conn DOI:10.1137/0715011 equ (3.2)  */
    REF_INT k;
    REF_DBL N[16];
    REF_DBL NNt[16];
    REF_DBL invNNt[16];
    REF_DBL NtinvNNt[16];
    REF_DBL NtinvNNtN[16];
    REF_DBL P[16];

    for (i = 0; i < nactive; i++) {
      N[i + nactive * 0] = 1.0;
      for (ixyz = 0; ixyz < 3; ixyz++)
        N[i + nactive * (1 + ixyz)] = -grads[ixyz + 3 * active[i]];
    }
    /* P = I - Nt [N Nt]^-1 N */
    for (i = 0; i < nactive; i++)
      for (j = 0; j < nactive; j++) NNt[i + j * nactive] = 0.0;
    for (i = 0; i < nactive; i++)
      for (j = 0; j < nactive; j++)
        for (k = 0; k < 4; k++)
          NNt[i + j * nactive] += N[i + nactive * k] * N[j + nactive * k];
    RSS(ref_matrix_inv_gen(nactive, NNt, invNNt), "inv");

    for (i = 0; i < 4; i++)
      for (j = 0; j < nactive; j++) NtinvNNt[i + 4 * j] = 0.0;

    for (i = 0; i < 4; i++)
      for (j = 0; j < nactive; j++)
        for (k = 0; k < nactive; k++)
          NtinvNNt[i + 4 * j] += N[k + i * nactive] * invNNt[k + j * nactive];

    for (i = 0; i < 4; i++)
      for (j = 0; j < 4; j++) NtinvNNtN[i + 4 * j] = 0.0;

    for (i = 0; i < 4; i++)
      for (j = 0; j < 4; j++)
        for (k = 0; k < nactive; k++)
          NtinvNNtN[i + 4 * j] += NtinvNNt[i + k * 4] * N[k + j * nactive];

    for (i = 0; i < 4; i++)
      for (j = 0; j < 4; j++) P[i + j * 4] = -NtinvNNtN[i + j * 4];
    for (i = 0; i < 4; i++) P[i + i * 4] += 1.0;

    for (ixyz = 0; ixyz < 3; ixyz++) dir[ixyz] = P[1 + ixyz];
  }

  RSS(ref_math_normalize(dir), "norm");

  m0 = ref_math_dot(dir, &(grads[3 * worst]));
  if (verbose)
    for (i = 0; i < nactive; i++)
      printf("slope %e\n", ref_math_dot(dir, &(grads[3 * active[i]])));
  if (0.0 >= m0) {
    printf("%s: %d: %s: m0 not positive %e", __FILE__, __LINE__, __func__, m0);
    *complete = REF_TRUE;
    goto success_clean_and_return;
  }
  mate = REF_EMPTY;
  min_alpha = 1.0e10;
  for (i = 0; i < degree; i++) {
    REF_BOOL skip;
    skip = REF_FALSE;
    for (j = 0; j < nactive; j++)
      if (i == active[j]) skip = REF_TRUE;
    if (skip) continue;
    m1 = ref_math_dot(dir, &(grads[3 * i]));
    /*
      cost = quals[i]+alpha*m1;
      cost = quals[worst]+alpha*m0;
      quals[i]+alpha*m1 = quals[worst]+alpha*m0;
    */
    if (!ref_math_divisible((quals[worst] - quals[i]), (m1 - m0))) continue;
    alpha = (quals[worst] - quals[i]) / (m1 - m0);
    if ((alpha > 0.0 && alpha < min_alpha)) {
      min_alpha = alpha;
      mate = i;
    }
  }
  if (REF_EMPTY == mate) {
    if (verbose) {
      for (i = 0; i < nactive; i++)
        printf("active slope %f %d\n",
               ref_math_dot(dir, &(grads[3 * active[i]])), i);
      for (i = 0; i < degree; i++)
        printf("all %f slope %f %d %e\n", quals[i],
               ref_math_dot(dir, &(grads[3 * i])), i,
               (1.0 - quals[i]) / ref_math_dot(dir, &(grads[3 * i])));
    }
    min_alpha = (1.0 - quals[0]) / ref_math_dot(dir, &(grads[3 * 0]));
    for (i = 1; i < degree; i++)
      min_alpha =
          MIN(min_alpha, (1.0 - quals[i]) / ref_math_dot(dir, &(grads[3 * i])));
  }

  alpha = min_alpha;
  last_alpha = 0.0;
  last_qual = 0.0;
  max_reductions = 8;
  for (reductions = 0; reductions < max_reductions; reductions++) {
    ref_node_xyz(ref_node, 0, node) = xyz[0] + alpha * dir[0];
    ref_node_xyz(ref_node, 1, node) = xyz[1] + alpha * dir[1];
    ref_node_xyz(ref_node, 2, node) = xyz[2] + alpha * dir[2];
    interp_status = ref_metric_interpolate_node(ref_grid, node);
    RXS(interp_status, REF_NOT_FOUND, "ref_metric_interpolate_node failed");

    RSS(ref_smooth_tet_quality_around(ref_grid, node, &quality), "rep");
    requirement = 0.9 * alpha * m0 + quals[worst];
    if (verbose)
      printf(" %d alpha %e min %f required %f actual %f\n", nactive, alpha,
             min_qual, requirement, quality);
    if (REF_SUCCESS == interp_status && reductions > 0 && quality < last_qual &&
        quality > min_qual) {
      if (verbose)
        printf("use last alpha %e min %f last_qual %f actual %f\n", last_alpha,
               min_qual, last_qual, quality);
      alpha = last_alpha;
      quality = last_qual;
      ref_node_xyz(ref_node, 0, node) = xyz[0] + alpha * dir[0];
      ref_node_xyz(ref_node, 1, node) = xyz[1] + alpha * dir[1];
      ref_node_xyz(ref_node, 2, node) = xyz[2] + alpha * dir[2];
      RXS(ref_metric_interpolate_node(ref_grid, node), REF_NOT_FOUND, "interp");
      break;
    }
    if (quality > requirement || alpha < 1.0e-12) break;
    last_alpha = alpha;
    last_qual = quality;
    alpha *= 0.5;
  }

  if (max_reductions <= reductions) { /* used all the reductions, step is small,
                                         marginal gains remain */
    ref_node_xyz(ref_node, 0, node) = xyz[0];
    ref_node_xyz(ref_node, 1, node) = xyz[1];
    ref_node_xyz(ref_node, 2, node) = xyz[2];
    if (REF_SUCCESS != interp_status && REF_EMPTY != interp_guess)
      ref_interp_cell(ref_interp, node) = interp_guess;
    RXS(ref_metric_interpolate_node(ref_grid, node), REF_NOT_FOUND, "interp");
    *complete = REF_TRUE;
  }

  if (3 == nactive &&
      (quality - min_qual) < 1.0e-5) { /* very small step toward forth active,
                                          marginal gains remain */
    *complete = REF_TRUE;
  }

success_clean_and_return:

  ref_free(grads);
  ref_free(quals);
  ref_free(active);
  ref_free(cells);
  return REF_SUCCESS;
}